

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O3

t_int * voutlet_doepilog(t_int *w)

{
  long lVar1;
  t_int tVar2;
  undefined4 *puVar3;
  t_int tVar4;
  long lVar5;
  
  lVar1 = w[1];
  tVar2 = w[3];
  if (*(int *)(lVar1 + 0x84) == *(int *)(lVar1 + 0x88)) {
    tVar4 = w[2];
  }
  else {
    tVar4 = *(long *)(lVar1 + 0x90);
  }
  puVar3 = *(undefined4 **)(lVar1 + 0x58);
  if ((int)tVar2 != 0) {
    lVar5 = 0;
    do {
      *(undefined4 *)(tVar4 + lVar5 * 4) = *puVar3;
      *puVar3 = 0;
      puVar3 = puVar3 + 1;
      lVar5 = lVar5 + 1;
    } while ((int)tVar2 != (int)lVar5);
  }
  if (puVar3 == *(undefined4 **)(lVar1 + 0x50)) {
    puVar3 = *(undefined4 **)(lVar1 + 0x48);
  }
  *(undefined4 **)(lVar1 + 0x58) = puVar3;
  return w + 4;
}

Assistant:

static t_int *voutlet_doepilog(t_int *w)
{
    t_voutlet *x = (t_voutlet *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);

    int n = (int)(w[3]);
    t_sample *in = x->x_empty;
    if (x->x_updown.downsample != x->x_updown.upsample)
        out = x->x_updown.s_vec;
    for (; n--; in++) *out++ = *in, *in = 0;
    if (in == x->x_endbuf) in = x->x_buf;
    x->x_empty = in;
    return (w+4);
}